

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O1

bool __thiscall luna::BarrieredMarkVisitor::Visit(BarrieredMarkVisitor *this,Function *f)

{
  byte bVar1;
  
  bVar1 = (f->super_GCObject).field_0x10;
  if ((bVar1 & 0xc) == 4 && (bVar1 & 3) != 0) {
    bVar1 = bVar1 & 0xf3;
  }
  else {
    if ((bVar1 & 0xf) != 0) {
      return false;
    }
    bVar1 = bVar1 | 4;
  }
  (f->super_GCObject).field_0x10 = bVar1;
  return true;
}

Assistant:

bool VisitObj(GCObject *obj)
        {
            // Visit member GC objects of obj when it is barriered object
            if (obj->generation_ != GCGen0 && obj->gc_ == GCFlag_Black)
            {
                obj->gc_ = GCFlag_White;
                return true;
            }

            // Visit GCGen0 generation object
            if (obj->generation_ == GCGen0 && obj->gc_ == GCFlag_White)
            {
                obj->gc_ = GCFlag_Black;
                return true;
            }
            return false;
        }